

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# piecewise_linear.cpp
# Opt level: O1

void __thiscall
mp::
BasicPLApproximator<mp::CustomFunctionalConstraint<std::array<int,_1UL>,_std::array<int,_0UL>,_mp::NumericFunctionalConstraintTraits,_mp::LogId>_>
::IncreaseStepWhileErrorSmallEnough
          (BasicPLApproximator<mp::CustomFunctionalConstraint<std::array<int,_1UL>,_std::array<int,_0UL>,_mp::NumericFunctionalConstraintTraits,_mp::LogId>_>
           *this,double x0,double f0,double *dx0)

{
  int iVar1;
  double extraout_XMM0_Qa;
  double dVar2;
  double dVar3;
  
  while( true ) {
    (*this->_vptr_BasicPLApproximator[9])(*dx0 + x0,this);
    if (((extraout_XMM0_Qa != f0) || (NAN(extraout_XMM0_Qa) || NAN(f0))) &&
       (iVar1 = (*this->_vptr_BasicPLApproximator[0x1b])(x0,f0,*dx0 + x0,extraout_XMM0_Qa,this),
       -1 < iVar1)) break;
    dVar3 = *dx0;
    *dx0 = dVar3 * 1.2;
    dVar2 = ub_sub(this);
    if (dVar2 < dVar3 * 1.2 + x0) {
      dVar3 = ub_sub(this);
      *dx0 = dVar3 - x0;
      return;
    }
  }
  return;
}

Assistant:

void BasicPLApproximator<FuncCon>::IncreaseStepWhileErrorSmallEnough(
    double x0, double f0, double& dx0) {
  double f1;
  while ( (f1=eval(x0+dx0))==f0 ||           // same value
          0 > CompareError(x0, f0, x0+dx0, f1) ) {
    dx0 *= 1.2;
    if (x0+dx0 > ub_sub()) {
      dx0 = ub_sub()-x0;
      break;
    }
  }
}